

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

void shift64ExtraRightJamming(uint64_t a0,uint64_t a1,int count,uint64_t *z0Ptr,uint64_t *z1Ptr)

{
  if (count != 0) {
    if (count < 0x40) {
      a1 = (ulong)(a1 != 0) | a0 << (-(byte)count & 0x3f);
      a0 = a0 >> ((byte)count & 0x3f);
    }
    else {
      if (count == 0x40) {
        a1 = a1 != 0 | a0;
      }
      else {
        a1 = (uint64_t)(a1 != 0 || a0 != 0);
      }
      a0 = 0;
    }
  }
  *z1Ptr = a1;
  *z0Ptr = a0;
  return;
}

Assistant:

static inline void
 shift64ExtraRightJamming(
     uint64_t a0, uint64_t a1, int count, uint64_t *z0Ptr, uint64_t *z1Ptr)
{
    uint64_t z0, z1;
    int8_t negCount = ( - count ) & 63;

    if ( count == 0 ) {
        z1 = a1;
        z0 = a0;
    }
    else if ( count < 64 ) {
        z1 = ( a0<<negCount ) | ( a1 != 0 );
        z0 = a0>>count;
    }
    else {
        if ( count == 64 ) {
            z1 = a0 | ( a1 != 0 );
        }
        else {
            z1 = ( ( a0 | a1 ) != 0 );
        }
        z0 = 0;
    }
    *z1Ptr = z1;
    *z0Ptr = z0;

}